

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O2

void polymul_internal::polynomial_multiplier<double,_1,_1,_6>::mul
               (double *dst,double *p1,double *p2)

{
  int i;
  long lVar1;
  int j;
  long lVar2;
  
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 7; lVar2 = lVar2 + 1) {
      dst[lVar2] = p1[lVar1] * p2[lVar2] + dst[lVar2];
    }
    dst = dst + 1;
  }
  return;
}

Assistant:

static void mul(numtype POLYMUL_RESTRICT dst[],
                  const numtype p1[],
                  const numtype p2[]) {
    for (int i = 0; i <= Ndeg1; i++)
      for (int j = 0; j <= Ndeg2; j++)
        dst[i + j] += p1[i] * p2[j];
  }